

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> * __thiscall
wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
          (FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this,
          FeatureSet feature,WeightedOption weightedOption,
          offset_in_TranslateToFuzzReader_to_subr rest)

{
  mapped_type *pmVar1;
  ulong uVar2;
  offset_in_TranslateToFuzzReader_to_subr local_58 [2];
  key_type local_44 [4];
  key_type local_34 [2];
  FeatureSet feature_local;
  
  local_34[0].features = feature.features;
  if (weightedOption.weight != 0) {
    uVar2 = 0;
    do {
      pmVar1 = std::
               map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
               ::operator[]((map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
                             *)this,local_34);
      std::
      vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
      ::push_back(pmVar1,&weightedOption.option);
      uVar2 = uVar2 + 1;
    } while (uVar2 < weightedOption.weight);
  }
  local_58[0] = rest;
  local_44[0].features = local_34[0].features;
  pmVar1 = std::
           map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
           ::operator[]((map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
                         *)this,local_44);
  std::
  vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
  ::push_back(pmVar1,local_58);
  return (FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)this;
}

Assistant:

FeatureOptions<T>&
    add(FeatureSet feature, WeightedOption weightedOption, Ts... rest) {
      for (size_t i = 0; i < weightedOption.weight; i++) {
        options[feature].push_back(weightedOption.option);
      }
      return add(feature, rest...);
    }